

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

void test_arithm<double>(uint length,double value1,double value2,bool allowTrash)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  bool bVar25;
  double *pdVar26;
  element_type *peVar27;
  undefined8 *puVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uint local_35f0;
  uint local_35ec;
  uint i_10;
  uint i_9;
  uint i_8;
  uint i_7;
  uint i_6;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  double r;
  uint i;
  double *result;
  double *v2;
  double *v1;
  shared_ptr<double> presult;
  undefined1 local_3580 [8];
  shared_ptr<double> pv2;
  shared_ptr<double> pv1;
  bool allowTrash_local;
  double value2_local;
  double value1_local;
  uint length_local;
  __m128d a;
  uint local_33bc;
  undefined1 (*local_33b8) [16];
  __m128d a_1;
  uint local_338c;
  undefined1 (*local_3388) [16];
  __m128d b0_3;
  __m128d a0_3;
  __m128d b0_2;
  __m128d a0_2;
  __m128d b1_1;
  __m128d b0_1;
  __m128d a1_1;
  __m128d a0_1;
  __m128d b3;
  __m128d b2;
  __m128d b1;
  __m128d b0;
  __m128d a3;
  __m128d a2;
  __m128d a1;
  __m128d a0;
  element_type *local_2eb0;
  undefined1 (*local_2ea8) [16];
  undefined1 (*local_2ea0) [16];
  __m128d b0_7;
  __m128d a0_7;
  __m128d b0_6;
  __m128d a0_6;
  __m128d b1_3;
  __m128d b0_5;
  __m128d a1_3;
  __m128d a0_5;
  __m128d b3_1;
  __m128d b2_1;
  __m128d b1_2;
  __m128d b0_4;
  __m128d a3_1;
  __m128d a2_1;
  __m128d a1_2;
  __m128d a0_4;
  element_type *local_2990;
  undefined1 (*local_2988) [16];
  undefined1 (*local_2980) [16];
  __m128d b0_11;
  __m128d a0_11;
  __m128d b0_10;
  __m128d a0_10;
  __m128d b1_5;
  __m128d b0_9;
  __m128d a1_5;
  __m128d a0_9;
  __m128d b3_2;
  __m128d b2_2;
  __m128d b1_4;
  __m128d b0_8;
  __m128d a3_2;
  __m128d a2_2;
  __m128d a1_4;
  __m128d a0_8;
  element_type *local_2470;
  undefined1 (*local_2468) [16];
  undefined1 (*local_2460) [16];
  __m128d b0_15;
  __m128d a0_15;
  __m128d b0_14;
  __m128d a0_14;
  __m128d b1_7;
  __m128d b0_13;
  __m128d a1_7;
  __m128d a0_13;
  __m128d b3_3;
  __m128d b2_3;
  __m128d b1_6;
  __m128d b0_12;
  __m128d a3_3;
  __m128d a2_3;
  __m128d a1_6;
  __m128d a0_12;
  element_type *local_1f50;
  undefined1 (*local_1f48) [16];
  undefined1 (*local_1f40) [16];
  __m128d a0_19;
  __m128d a0_18;
  __m128d a1_9;
  __m128d a0_17;
  __m128d a3_4;
  __m128d a2_4;
  __m128d a1_8;
  __m128d a0_16;
  __m128d b;
  element_type *local_1aa0;
  undefined1 (*local_1a90) [16];
  __m128d a0_23;
  __m128d a0_22;
  __m128d a1_11;
  __m128d a0_21;
  __m128d a3_5;
  __m128d a2_5;
  __m128d a1_10;
  __m128d a0_20;
  __m128d b_1;
  element_type *local_1660;
  undefined1 (*local_1650) [16];
  __m128d a0_27;
  __m128d a0_26;
  __m128d a1_13;
  __m128d a0_25;
  __m128d a3_6;
  __m128d a2_6;
  __m128d a1_12;
  __m128d a0_24;
  __m128d b_2;
  element_type *local_1230;
  undefined1 (*local_1220) [16];
  __m128d a0_31;
  __m128d a0_30;
  __m128d a1_15;
  __m128d a0_29;
  __m128d a3_7;
  __m128d a2_7;
  __m128d a1_14;
  __m128d a0_28;
  __m128d b_3;
  element_type *local_d00;
  undefined1 (*local_cf0) [16];
  __m128d a0_35;
  __m128d a0_34;
  __m128d a1_17;
  __m128d a0_33;
  __m128d a3_8;
  __m128d a2_8;
  __m128d a1_16;
  __m128d a0_32;
  __m128d b_4;
  element_type *local_8d0;
  undefined1 (*local_8c0) [16];
  __m128d a0_39;
  __m128d a0_38;
  __m128d a1_19;
  __m128d a0_37;
  __m128d a3_9;
  __m128d a2_9;
  __m128d a1_18;
  __m128d a0_36;
  __m128d b_5;
  element_type *local_4a0;
  undefined1 (*local_490) [16];
  
  pdVar26 = nosimd::common::malloc<double>(length);
  std::shared_ptr<double>::shared_ptr<double,void(*)(double*),void>
            ((shared_ptr<double> *)
             &pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pdVar26,
             nosimd::common::free<double>);
  pdVar26 = nosimd::common::malloc<double>(length);
  std::shared_ptr<double>::shared_ptr<double,void(*)(double*),void>
            ((shared_ptr<double> *)local_3580,pdVar26,nosimd::common::free<double>);
  pdVar26 = nosimd::common::malloc<double>(length + 1);
  std::shared_ptr<double>::shared_ptr<double,void(*)(double*),void>
            ((shared_ptr<double> *)&v1,pdVar26,nosimd::common::free<double>);
  local_490 = (undefined1 (*) [16])
              std::__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2> *)
                         &pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1f48 = (undefined1 (*) [16])
               std::__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2> *)local_3580);
  peVar27 = std::__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2> *)&v1);
  peVar27[length] = 127.0;
  local_33b8 = local_490;
  for (local_33bc = length; 7 < (int)local_33bc; local_33bc = local_33bc - 8) {
    *(double *)*local_33b8 = value1;
    *(double *)(*local_33b8 + 8) = value1;
    *(double *)local_33b8[1] = value1;
    *(double *)(local_33b8[1] + 8) = value1;
    *(double *)local_33b8[2] = value1;
    *(double *)(local_33b8[2] + 8) = value1;
    *(double *)local_33b8[3] = value1;
    *(double *)(local_33b8[3] + 8) = value1;
    local_33b8 = local_33b8 + 4;
  }
  if (3 < (int)local_33bc) {
    *(double *)*local_33b8 = value1;
    *(double *)(*local_33b8 + 8) = value1;
    *(double *)local_33b8[1] = value1;
    *(double *)(local_33b8[1] + 8) = value1;
    local_33bc = local_33bc - 4;
    local_33b8 = local_33b8 + 2;
  }
  if (1 < (int)local_33bc) {
    *(double *)*local_33b8 = value1;
    *(double *)(*local_33b8 + 8) = value1;
    local_33bc = local_33bc - 2;
    local_33b8 = local_33b8 + 1;
  }
  local_338c = length;
  local_3388 = local_1f48;
  if (local_33bc != 0) {
    *(double *)*local_33b8 = value1;
  }
  for (; 7 < (int)local_338c; local_338c = local_338c - 8) {
    *(double *)*local_3388 = value2;
    *(double *)(*local_3388 + 8) = value2;
    *(double *)local_3388[1] = value2;
    *(double *)(local_3388[1] + 8) = value2;
    *(double *)local_3388[2] = value2;
    *(double *)(local_3388[2] + 8) = value2;
    *(double *)local_3388[3] = value2;
    *(double *)(local_3388[3] + 8) = value2;
    local_3388 = local_3388 + 4;
  }
  if (3 < (int)local_338c) {
    *(double *)*local_3388 = value2;
    *(double *)(*local_3388 + 8) = value2;
    *(double *)local_3388[1] = value2;
    *(double *)(local_3388[1] + 8) = value2;
    local_338c = local_338c - 4;
    local_3388 = local_3388 + 2;
  }
  if (1 < (int)local_338c) {
    *(double *)*local_3388 = value2;
    *(double *)(*local_3388 + 8) = value2;
    local_338c = local_338c - 2;
    local_3388 = local_3388 + 1;
  }
  if (local_338c != 0) {
    *(double *)*local_3388 = value2;
  }
  for (r._4_4_ = 0; r._4_4_ < length; r._4_4_ = r._4_4_ + 1) {
    bVar25 = anon_unknown.dwarf_1996d::equal<double>
                       (*(double *)(*local_490 + (ulong)r._4_4_ * 8),value1);
    if ((!bVar25) ||
       (bVar25 = anon_unknown.dwarf_1996d::equal<double>
                           (*(double *)(*local_1f48 + (ulong)r._4_4_ * 8),value2), !bVar25)) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar28 + 1) = 0x1a;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  local_2eb0 = peVar27;
  local_2ea8 = local_1f48;
  local_2ea0 = local_490;
  for (a0[1]._4_4_ = length; 7 < (int)a0[1]._4_4_; a0[1]._4_4_ = a0[1]._4_4_ - 8) {
    dVar1 = *(double *)(*local_2ea0 + 8);
    dVar2 = *(double *)local_2ea0[1];
    dVar3 = *(double *)(local_2ea0[1] + 8);
    dVar4 = *(double *)local_2ea0[2];
    dVar5 = *(double *)(local_2ea0[2] + 8);
    dVar6 = *(double *)local_2ea0[3];
    dVar7 = *(double *)(local_2ea0[3] + 8);
    dVar8 = *(double *)(*local_2ea8 + 8);
    dVar9 = *(double *)local_2ea8[1];
    dVar10 = *(double *)(local_2ea8[1] + 8);
    dVar11 = *(double *)local_2ea8[2];
    dVar12 = *(double *)(local_2ea8[2] + 8);
    dVar13 = *(double *)local_2ea8[3];
    dVar14 = *(double *)(local_2ea8[3] + 8);
    *local_2eb0 = *(double *)*local_2ea0 + *(double *)*local_2ea8;
    local_2eb0[1] = dVar1 + dVar8;
    local_2eb0[2] = dVar2 + dVar9;
    local_2eb0[3] = dVar3 + dVar10;
    local_2eb0[4] = dVar4 + dVar11;
    local_2eb0[5] = dVar5 + dVar12;
    local_2eb0[6] = dVar6 + dVar13;
    local_2eb0[7] = dVar7 + dVar14;
    local_2ea0 = local_2ea0 + 4;
    local_2ea8 = local_2ea8 + 4;
    local_2eb0 = local_2eb0 + 8;
  }
  for (; 3 < (int)a0[1]._4_4_; a0[1]._4_4_ = a0[1]._4_4_ - 4) {
    dVar1 = *(double *)(*local_2ea0 + 8);
    dVar2 = *(double *)local_2ea0[1];
    dVar3 = *(double *)(local_2ea0[1] + 8);
    dVar4 = *(double *)(*local_2ea8 + 8);
    dVar5 = *(double *)local_2ea8[1];
    dVar6 = *(double *)(local_2ea8[1] + 8);
    *local_2eb0 = *(double *)*local_2ea0 + *(double *)*local_2ea8;
    local_2eb0[1] = dVar1 + dVar4;
    local_2eb0[2] = dVar2 + dVar5;
    local_2eb0[3] = dVar3 + dVar6;
    local_2ea0 = local_2ea0 + 2;
    local_2ea8 = local_2ea8 + 2;
    local_2eb0 = local_2eb0 + 4;
  }
  if (1 < (int)a0[1]._4_4_) {
    dVar1 = *(double *)(*local_2ea0 + 8);
    dVar2 = *(double *)(*local_2ea8 + 8);
    *local_2eb0 = *(double *)*local_2ea0 + *(double *)*local_2ea8;
    local_2eb0[1] = dVar1 + dVar2;
    a0[1]._4_4_ = a0[1]._4_4_ - 2;
    local_2ea0 = local_2ea0 + 1;
    local_2ea8 = local_2ea8 + 1;
    local_2eb0 = local_2eb0 + 2;
  }
  if (a0[1]._4_4_ != 0) {
    *local_2eb0 = *(double *)*local_2ea0 + *(double *)*local_2ea8;
  }
  for (i_3 = 0; i_3 < length; i_3 = i_3 + 1) {
    bVar25 = anon_unknown.dwarf_1996d::equal<double>(peVar27[i_3],value1 + value2);
    if (!bVar25) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar28 + 1) = 0x22;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  local_2990 = peVar27;
  local_2988 = local_1f48;
  local_2980 = local_490;
  for (a0_4[1]._4_4_ = length; 7 < (int)a0_4[1]._4_4_; a0_4[1]._4_4_ = a0_4[1]._4_4_ - 8) {
    dVar1 = *(double *)(*local_2980 + 8);
    dVar2 = *(double *)local_2980[1];
    dVar3 = *(double *)(local_2980[1] + 8);
    dVar4 = *(double *)local_2980[2];
    dVar5 = *(double *)(local_2980[2] + 8);
    dVar6 = *(double *)local_2980[3];
    dVar7 = *(double *)(local_2980[3] + 8);
    dVar8 = *(double *)(*local_2988 + 8);
    dVar9 = *(double *)local_2988[1];
    dVar10 = *(double *)(local_2988[1] + 8);
    dVar11 = *(double *)local_2988[2];
    dVar12 = *(double *)(local_2988[2] + 8);
    dVar13 = *(double *)local_2988[3];
    dVar14 = *(double *)(local_2988[3] + 8);
    *local_2990 = *(double *)*local_2980 - *(double *)*local_2988;
    local_2990[1] = dVar1 - dVar8;
    local_2990[2] = dVar2 - dVar9;
    local_2990[3] = dVar3 - dVar10;
    local_2990[4] = dVar4 - dVar11;
    local_2990[5] = dVar5 - dVar12;
    local_2990[6] = dVar6 - dVar13;
    local_2990[7] = dVar7 - dVar14;
    local_2980 = local_2980 + 4;
    local_2988 = local_2988 + 4;
    local_2990 = local_2990 + 8;
  }
  for (; 3 < (int)a0_4[1]._4_4_; a0_4[1]._4_4_ = a0_4[1]._4_4_ - 4) {
    dVar1 = *(double *)(*local_2980 + 8);
    dVar2 = *(double *)local_2980[1];
    dVar3 = *(double *)(local_2980[1] + 8);
    dVar4 = *(double *)(*local_2988 + 8);
    dVar5 = *(double *)local_2988[1];
    dVar6 = *(double *)(local_2988[1] + 8);
    *local_2990 = *(double *)*local_2980 - *(double *)*local_2988;
    local_2990[1] = dVar1 - dVar4;
    local_2990[2] = dVar2 - dVar5;
    local_2990[3] = dVar3 - dVar6;
    local_2980 = local_2980 + 2;
    local_2988 = local_2988 + 2;
    local_2990 = local_2990 + 4;
  }
  if (1 < (int)a0_4[1]._4_4_) {
    dVar1 = *(double *)(*local_2980 + 8);
    dVar2 = *(double *)(*local_2988 + 8);
    *local_2990 = *(double *)*local_2980 - *(double *)*local_2988;
    local_2990[1] = dVar1 - dVar2;
    a0_4[1]._4_4_ = a0_4[1]._4_4_ - 2;
    local_2980 = local_2980 + 1;
    local_2988 = local_2988 + 1;
    local_2990 = local_2990 + 2;
  }
  if (a0_4[1]._4_4_ != 0) {
    *local_2990 = *(double *)*local_2980 - *(double *)*local_2988;
  }
  for (i_4 = 0; i_4 < length; i_4 = i_4 + 1) {
    bVar25 = anon_unknown.dwarf_1996d::equal<double>(peVar27[i_4],value1 - value2);
    if (!bVar25) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar28 + 1) = 0x2a;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  local_2470 = peVar27;
  local_2468 = local_1f48;
  local_2460 = local_490;
  for (a0_8[1]._4_4_ = length; 7 < (int)a0_8[1]._4_4_; a0_8[1]._4_4_ = a0_8[1]._4_4_ - 8) {
    dVar1 = *(double *)(*local_2460 + 8);
    dVar2 = *(double *)local_2460[1];
    dVar3 = *(double *)(local_2460[1] + 8);
    dVar4 = *(double *)local_2460[2];
    dVar5 = *(double *)(local_2460[2] + 8);
    dVar6 = *(double *)local_2460[3];
    dVar7 = *(double *)(local_2460[3] + 8);
    dVar8 = *(double *)(*local_2468 + 8);
    dVar9 = *(double *)local_2468[1];
    dVar10 = *(double *)(local_2468[1] + 8);
    dVar11 = *(double *)local_2468[2];
    dVar12 = *(double *)(local_2468[2] + 8);
    dVar13 = *(double *)local_2468[3];
    dVar14 = *(double *)(local_2468[3] + 8);
    *local_2470 = *(double *)*local_2460 * *(double *)*local_2468;
    local_2470[1] = dVar1 * dVar8;
    local_2470[2] = dVar2 * dVar9;
    local_2470[3] = dVar3 * dVar10;
    local_2470[4] = dVar4 * dVar11;
    local_2470[5] = dVar5 * dVar12;
    local_2470[6] = dVar6 * dVar13;
    local_2470[7] = dVar7 * dVar14;
    local_2460 = local_2460 + 4;
    local_2468 = local_2468 + 4;
    local_2470 = local_2470 + 8;
  }
  for (; 3 < (int)a0_8[1]._4_4_; a0_8[1]._4_4_ = a0_8[1]._4_4_ - 4) {
    dVar1 = *(double *)(*local_2460 + 8);
    dVar2 = *(double *)local_2460[1];
    dVar3 = *(double *)(local_2460[1] + 8);
    dVar4 = *(double *)(*local_2468 + 8);
    dVar5 = *(double *)local_2468[1];
    dVar6 = *(double *)(local_2468[1] + 8);
    *local_2470 = *(double *)*local_2460 * *(double *)*local_2468;
    local_2470[1] = dVar1 * dVar4;
    local_2470[2] = dVar2 * dVar5;
    local_2470[3] = dVar3 * dVar6;
    local_2460 = local_2460 + 2;
    local_2468 = local_2468 + 2;
    local_2470 = local_2470 + 4;
  }
  if (1 < (int)a0_8[1]._4_4_) {
    dVar1 = *(double *)(*local_2460 + 8);
    dVar2 = *(double *)(*local_2468 + 8);
    *local_2470 = *(double *)*local_2460 * *(double *)*local_2468;
    local_2470[1] = dVar1 * dVar2;
    a0_8[1]._4_4_ = a0_8[1]._4_4_ - 2;
    local_2460 = local_2460 + 1;
    local_2468 = local_2468 + 1;
    local_2470 = local_2470 + 2;
  }
  if (a0_8[1]._4_4_ != 0) {
    *local_2470 = *(double *)*local_2460 * *(double *)*local_2468;
  }
  for (i_5 = 0; i_5 < length; i_5 = i_5 + 1) {
    bVar25 = anon_unknown.dwarf_1996d::equal<double>(peVar27[i_5],value1 * value2);
    if (!bVar25) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar28 + 1) = 0x32;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  local_1f50 = peVar27;
  local_1f40 = local_490;
  for (a0_12[1]._4_4_ = length; 7 < (int)a0_12[1]._4_4_; a0_12[1]._4_4_ = a0_12[1]._4_4_ - 8) {
    auVar29 = divpd(*local_1f40,*local_1f48);
    auVar30 = divpd(local_1f40[1],local_1f48[1]);
    auVar31 = divpd(local_1f40[2],local_1f48[2]);
    auVar32 = divpd(local_1f40[3],local_1f48[3]);
    a1_6[1] = auVar29._0_8_;
    a0_12[0] = auVar29._8_8_;
    *local_1f50 = a1_6[1];
    local_1f50[1] = a0_12[0];
    a2_3[1] = auVar30._0_8_;
    a1_6[0] = auVar30._8_8_;
    local_1f50[2] = a2_3[1];
    local_1f50[3] = a1_6[0];
    a3_3[1] = auVar31._0_8_;
    a2_3[0] = auVar31._8_8_;
    local_1f50[4] = a3_3[1];
    local_1f50[5] = a2_3[0];
    b0_12[1] = auVar32._0_8_;
    a3_3[0] = auVar32._8_8_;
    local_1f50[6] = b0_12[1];
    local_1f50[7] = a3_3[0];
    local_1f40 = local_1f40 + 4;
    local_1f48 = local_1f48 + 4;
    local_1f50 = local_1f50 + 8;
  }
  for (; 3 < (int)a0_12[1]._4_4_; a0_12[1]._4_4_ = a0_12[1]._4_4_ - 4) {
    auVar29 = divpd(*local_1f40,*local_1f48);
    auVar30 = divpd(local_1f40[1],local_1f48[1]);
    a1_7[1] = auVar29._0_8_;
    a0_13[0] = auVar29._8_8_;
    *local_1f50 = a1_7[1];
    local_1f50[1] = a0_13[0];
    b0_13[1] = auVar30._0_8_;
    a1_7[0] = auVar30._8_8_;
    local_1f50[2] = b0_13[1];
    local_1f50[3] = a1_7[0];
    local_1f40 = local_1f40 + 2;
    local_1f48 = local_1f48 + 2;
    local_1f50 = local_1f50 + 4;
  }
  if (1 < (int)a0_12[1]._4_4_) {
    auVar29 = divpd(*local_1f40,*local_1f48);
    b0_14[1] = auVar29._0_8_;
    a0_14[0] = auVar29._8_8_;
    *local_1f50 = b0_14[1];
    local_1f50[1] = a0_14[0];
    a0_12[1]._4_4_ = a0_12[1]._4_4_ - 2;
    local_1f40 = local_1f40 + 1;
    local_1f48 = local_1f48 + 1;
    local_1f50 = local_1f50 + 2;
  }
  if (a0_12[1]._4_4_ != 0) {
    *local_1f50 = *(double *)*local_1f40 / *(double *)*local_1f48;
  }
  for (i_6 = 0; i_6 < length; i_6 = i_6 + 1) {
    bVar25 = anon_unknown.dwarf_1996d::equal<double>(peVar27[i_6],value1 / value2);
    if (!bVar25) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar28 + 1) = 0x3a;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  local_1aa0 = peVar27;
  local_1a90 = local_490;
  for (b[1]._4_4_ = length; 7 < (int)b[1]._4_4_; b[1]._4_4_ = b[1]._4_4_ - 8) {
    dVar1 = *(double *)(*local_1a90 + 8);
    dVar2 = *(double *)local_1a90[1];
    dVar3 = *(double *)(local_1a90[1] + 8);
    dVar4 = *(double *)local_1a90[2];
    dVar5 = *(double *)(local_1a90[2] + 8);
    dVar6 = *(double *)local_1a90[3];
    dVar7 = *(double *)(local_1a90[3] + 8);
    *local_1aa0 = *(double *)*local_1a90 + value2;
    local_1aa0[1] = dVar1 + value2;
    local_1aa0[2] = dVar2 + value2;
    local_1aa0[3] = dVar3 + value2;
    local_1aa0[4] = dVar4 + value2;
    local_1aa0[5] = dVar5 + value2;
    local_1aa0[6] = dVar6 + value2;
    local_1aa0[7] = dVar7 + value2;
    local_1a90 = local_1a90 + 4;
    local_1aa0 = local_1aa0 + 8;
  }
  for (; 3 < (int)b[1]._4_4_; b[1]._4_4_ = b[1]._4_4_ - 4) {
    dVar1 = *(double *)(*local_1a90 + 8);
    dVar2 = *(double *)local_1a90[1];
    dVar3 = *(double *)(local_1a90[1] + 8);
    *local_1aa0 = *(double *)*local_1a90 + value2;
    local_1aa0[1] = dVar1 + value2;
    local_1aa0[2] = dVar2 + value2;
    local_1aa0[3] = dVar3 + value2;
    local_1a90 = local_1a90 + 2;
    local_1aa0 = local_1aa0 + 4;
  }
  if (1 < (int)b[1]._4_4_) {
    dVar1 = *(double *)(*local_1a90 + 8);
    *local_1aa0 = *(double *)*local_1a90 + value2;
    local_1aa0[1] = dVar1 + value2;
    b[1]._4_4_ = b[1]._4_4_ - 2;
    local_1a90 = local_1a90 + 1;
    local_1aa0 = local_1aa0 + 2;
  }
  if (b[1]._4_4_ != 0) {
    *local_1aa0 = *(double *)*local_1a90 + value2;
  }
  for (i_7 = 0; i_7 < length; i_7 = i_7 + 1) {
    bVar25 = anon_unknown.dwarf_1996d::equal<double>(peVar27[i_7],value1 + value2);
    if (!bVar25) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar28 + 1) = 0x43;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  local_1660 = peVar27;
  local_1650 = local_490;
  for (b_1[1]._4_4_ = length; 7 < (int)b_1[1]._4_4_; b_1[1]._4_4_ = b_1[1]._4_4_ - 8) {
    dVar1 = *(double *)(*local_1650 + 8);
    dVar2 = *(double *)local_1650[1];
    dVar3 = *(double *)(local_1650[1] + 8);
    dVar4 = *(double *)local_1650[2];
    dVar5 = *(double *)(local_1650[2] + 8);
    dVar6 = *(double *)local_1650[3];
    dVar7 = *(double *)(local_1650[3] + 8);
    *local_1660 = *(double *)*local_1650 - value2;
    local_1660[1] = dVar1 - value2;
    local_1660[2] = dVar2 - value2;
    local_1660[3] = dVar3 - value2;
    local_1660[4] = dVar4 - value2;
    local_1660[5] = dVar5 - value2;
    local_1660[6] = dVar6 - value2;
    local_1660[7] = dVar7 - value2;
    local_1650 = local_1650 + 4;
    local_1660 = local_1660 + 8;
  }
  for (; 3 < (int)b_1[1]._4_4_; b_1[1]._4_4_ = b_1[1]._4_4_ - 4) {
    dVar1 = *(double *)(*local_1650 + 8);
    dVar2 = *(double *)local_1650[1];
    dVar3 = *(double *)(local_1650[1] + 8);
    *local_1660 = *(double *)*local_1650 - value2;
    local_1660[1] = dVar1 - value2;
    local_1660[2] = dVar2 - value2;
    local_1660[3] = dVar3 - value2;
    local_1650 = local_1650 + 2;
    local_1660 = local_1660 + 4;
  }
  if (1 < (int)b_1[1]._4_4_) {
    dVar1 = *(double *)(*local_1650 + 8);
    *local_1660 = *(double *)*local_1650 - value2;
    local_1660[1] = dVar1 - value2;
    b_1[1]._4_4_ = b_1[1]._4_4_ - 2;
    local_1650 = local_1650 + 1;
    local_1660 = local_1660 + 2;
  }
  if (b_1[1]._4_4_ != 0) {
    *local_1660 = *(double *)*local_1650 - value2;
  }
  for (i_8 = 0; i_8 < length; i_8 = i_8 + 1) {
    if ((peVar27[i_8] != value1 - value2) || (NAN(peVar27[i_8]) || NAN(value1 - value2))) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar28 + 1) = 0x4b;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  local_1230 = peVar27;
  local_1220 = local_490;
  for (b_2[1]._4_4_ = length; 7 < (int)b_2[1]._4_4_; b_2[1]._4_4_ = b_2[1]._4_4_ - 8) {
    dVar1 = *(double *)(*local_1220 + 8);
    dVar2 = *(double *)local_1220[1];
    dVar3 = *(double *)(local_1220[1] + 8);
    dVar4 = *(double *)local_1220[2];
    dVar5 = *(double *)(local_1220[2] + 8);
    dVar6 = *(double *)local_1220[3];
    dVar7 = *(double *)(local_1220[3] + 8);
    *local_1230 = value2 - *(double *)*local_1220;
    local_1230[1] = value2 - dVar1;
    local_1230[2] = value2 - dVar2;
    local_1230[3] = value2 - dVar3;
    local_1230[4] = value2 - dVar4;
    local_1230[5] = value2 - dVar5;
    local_1230[6] = value2 - dVar6;
    local_1230[7] = value2 - dVar7;
    local_1220 = local_1220 + 4;
    local_1230 = local_1230 + 8;
  }
  for (; 3 < (int)b_2[1]._4_4_; b_2[1]._4_4_ = b_2[1]._4_4_ - 4) {
    dVar1 = *(double *)(*local_1220 + 8);
    dVar2 = *(double *)local_1220[1];
    dVar3 = *(double *)(local_1220[1] + 8);
    *local_1230 = value2 - *(double *)*local_1220;
    local_1230[1] = value2 - dVar1;
    local_1230[2] = value2 - dVar2;
    local_1230[3] = value2 - dVar3;
    local_1220 = local_1220 + 2;
    local_1230 = local_1230 + 4;
  }
  if (1 < (int)b_2[1]._4_4_) {
    dVar1 = *(double *)(*local_1220 + 8);
    *local_1230 = value2 - *(double *)*local_1220;
    local_1230[1] = value2 - dVar1;
    b_2[1]._4_4_ = b_2[1]._4_4_ - 2;
    local_1220 = local_1220 + 1;
    local_1230 = local_1230 + 2;
  }
  if (b_2[1]._4_4_ != 0) {
    *local_1230 = value2 - *(double *)*local_1220;
  }
  for (i_9 = 0; i_9 < length; i_9 = i_9 + 1) {
    bVar25 = anon_unknown.dwarf_1996d::equal<double>(peVar27[i_9],value2 - value1);
    if (!bVar25) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar28 + 1) = 0x53;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  local_d00 = peVar27;
  local_cf0 = local_490;
  for (b_3[1]._4_4_ = length; 7 < (int)b_3[1]._4_4_; b_3[1]._4_4_ = b_3[1]._4_4_ - 8) {
    dVar1 = *(double *)(*local_cf0 + 8);
    dVar2 = *(double *)local_cf0[1];
    dVar3 = *(double *)(local_cf0[1] + 8);
    dVar4 = *(double *)local_cf0[2];
    dVar5 = *(double *)(local_cf0[2] + 8);
    dVar6 = *(double *)local_cf0[3];
    dVar7 = *(double *)(local_cf0[3] + 8);
    *local_d00 = *(double *)*local_cf0 * value2;
    local_d00[1] = dVar1 * value2;
    local_d00[2] = dVar2 * value2;
    local_d00[3] = dVar3 * value2;
    local_d00[4] = dVar4 * value2;
    local_d00[5] = dVar5 * value2;
    local_d00[6] = dVar6 * value2;
    local_d00[7] = dVar7 * value2;
    local_cf0 = local_cf0 + 4;
    local_d00 = local_d00 + 8;
  }
  for (; 3 < (int)b_3[1]._4_4_; b_3[1]._4_4_ = b_3[1]._4_4_ - 4) {
    dVar1 = *(double *)(*local_cf0 + 8);
    dVar2 = *(double *)local_cf0[1];
    dVar3 = *(double *)(local_cf0[1] + 8);
    *local_d00 = *(double *)*local_cf0 * value2;
    local_d00[1] = dVar1 * value2;
    local_d00[2] = dVar2 * value2;
    local_d00[3] = dVar3 * value2;
    local_cf0 = local_cf0 + 2;
    local_d00 = local_d00 + 4;
  }
  if (1 < (int)b_3[1]._4_4_) {
    dVar1 = *(double *)(*local_cf0 + 8);
    *local_d00 = *(double *)*local_cf0 * value2;
    local_d00[1] = dVar1 * value2;
    b_3[1]._4_4_ = b_3[1]._4_4_ - 2;
    local_cf0 = local_cf0 + 1;
    local_d00 = local_d00 + 2;
  }
  if (b_3[1]._4_4_ != 0) {
    *local_d00 = *(double *)*local_cf0 * value2;
  }
  for (i_10 = 0; i_10 < length; i_10 = i_10 + 1) {
    if ((peVar27[i_10] != value1 * value2) || (NAN(peVar27[i_10]) || NAN(value1 * value2))) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar28 + 1) = 0x5b;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  local_8d0 = peVar27;
  local_8c0 = local_490;
  for (b_4[1]._4_4_ = length; 7 < (int)b_4[1]._4_4_; b_4[1]._4_4_ = b_4[1]._4_4_ - 8) {
    auVar32._8_8_ = value2;
    auVar32._0_8_ = value2;
    auVar32 = divpd(*local_8c0,auVar32);
    auVar31._8_8_ = value2;
    auVar31._0_8_ = value2;
    auVar31 = divpd(local_8c0[1],auVar31);
    auVar30._8_8_ = value2;
    auVar30._0_8_ = value2;
    auVar30 = divpd(local_8c0[2],auVar30);
    auVar29._8_8_ = value2;
    auVar29._0_8_ = value2;
    auVar29 = divpd(local_8c0[3],auVar29);
    a1_16[1] = auVar32._0_8_;
    a0_32[0] = auVar32._8_8_;
    *local_8d0 = a1_16[1];
    local_8d0[1] = a0_32[0];
    a2_8[1] = auVar31._0_8_;
    a1_16[0] = auVar31._8_8_;
    local_8d0[2] = a2_8[1];
    local_8d0[3] = a1_16[0];
    a3_8[1] = auVar30._0_8_;
    a2_8[0] = auVar30._8_8_;
    local_8d0[4] = a3_8[1];
    local_8d0[5] = a2_8[0];
    a0_33[1] = auVar29._0_8_;
    a3_8[0] = auVar29._8_8_;
    local_8d0[6] = a0_33[1];
    local_8d0[7] = a3_8[0];
    local_8c0 = local_8c0 + 4;
    local_8d0 = local_8d0 + 8;
  }
  for (; 3 < (int)b_4[1]._4_4_; b_4[1]._4_4_ = b_4[1]._4_4_ - 4) {
    auVar17._8_8_ = value2;
    auVar17._0_8_ = value2;
    auVar29 = divpd(*local_8c0,auVar17);
    auVar16._8_8_ = value2;
    auVar16._0_8_ = value2;
    auVar30 = divpd(local_8c0[1],auVar16);
    a1_17[1] = auVar29._0_8_;
    a0_33[0] = auVar29._8_8_;
    *local_8d0 = a1_17[1];
    local_8d0[1] = a0_33[0];
    a0_34[1] = auVar30._0_8_;
    a1_17[0] = auVar30._8_8_;
    local_8d0[2] = a0_34[1];
    local_8d0[3] = a1_17[0];
    local_8c0 = local_8c0 + 2;
    local_8d0 = local_8d0 + 4;
  }
  if (1 < (int)b_4[1]._4_4_) {
    auVar15._8_8_ = value2;
    auVar15._0_8_ = value2;
    auVar29 = divpd(*local_8c0,auVar15);
    a0_35[1] = auVar29._0_8_;
    a0_34[0] = auVar29._8_8_;
    *local_8d0 = a0_35[1];
    local_8d0[1] = a0_34[0];
    b_4[1]._4_4_ = b_4[1]._4_4_ - 2;
    local_8c0 = local_8c0 + 1;
    local_8d0 = local_8d0 + 2;
  }
  if (b_4[1]._4_4_ != 0) {
    *local_8d0 = *(double *)*local_8c0 / value2;
  }
  for (local_35ec = 0; local_35ec < length; local_35ec = local_35ec + 1) {
    bVar25 = anon_unknown.dwarf_1996d::equal<double>(peVar27[local_35ec],value1 / value2);
    if (!bVar25) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar28 + 1) = 99;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  local_4a0 = peVar27;
  for (b_5[1]._4_4_ = length; 7 < (int)b_5[1]._4_4_; b_5[1]._4_4_ = b_5[1]._4_4_ - 8) {
    auVar21._8_8_ = value2;
    auVar21._0_8_ = value2;
    auVar29 = divpd(auVar21,*local_490);
    auVar20._8_8_ = value2;
    auVar20._0_8_ = value2;
    auVar30 = divpd(auVar20,local_490[1]);
    auVar19._8_8_ = value2;
    auVar19._0_8_ = value2;
    auVar31 = divpd(auVar19,local_490[2]);
    auVar18._8_8_ = value2;
    auVar18._0_8_ = value2;
    auVar32 = divpd(auVar18,local_490[3]);
    a1_18[1] = auVar29._0_8_;
    a0_36[0] = auVar29._8_8_;
    *local_4a0 = a1_18[1];
    local_4a0[1] = a0_36[0];
    a2_9[1] = auVar30._0_8_;
    a1_18[0] = auVar30._8_8_;
    local_4a0[2] = a2_9[1];
    local_4a0[3] = a1_18[0];
    a3_9[1] = auVar31._0_8_;
    a2_9[0] = auVar31._8_8_;
    local_4a0[4] = a3_9[1];
    local_4a0[5] = a2_9[0];
    a0_37[1] = auVar32._0_8_;
    a3_9[0] = auVar32._8_8_;
    local_4a0[6] = a0_37[1];
    local_4a0[7] = a3_9[0];
    local_490 = local_490 + 4;
    local_4a0 = local_4a0 + 8;
  }
  for (; 3 < (int)b_5[1]._4_4_; b_5[1]._4_4_ = b_5[1]._4_4_ - 4) {
    auVar23._8_8_ = value2;
    auVar23._0_8_ = value2;
    auVar29 = divpd(auVar23,*local_490);
    auVar22._8_8_ = value2;
    auVar22._0_8_ = value2;
    auVar30 = divpd(auVar22,local_490[1]);
    a1_19[1] = auVar29._0_8_;
    a0_37[0] = auVar29._8_8_;
    *local_4a0 = a1_19[1];
    local_4a0[1] = a0_37[0];
    a0_38[1] = auVar30._0_8_;
    a1_19[0] = auVar30._8_8_;
    local_4a0[2] = a0_38[1];
    local_4a0[3] = a1_19[0];
    local_490 = local_490 + 2;
    local_4a0 = local_4a0 + 4;
  }
  if (1 < (int)b_5[1]._4_4_) {
    auVar24._8_8_ = value2;
    auVar24._0_8_ = value2;
    auVar29 = divpd(auVar24,*local_490);
    a0_39[1] = auVar29._0_8_;
    a0_38[0] = auVar29._8_8_;
    *local_4a0 = a0_39[1];
    local_4a0[1] = a0_38[0];
    b_5[1]._4_4_ = b_5[1]._4_4_ - 2;
    local_490 = local_490 + 1;
    local_4a0 = local_4a0 + 2;
  }
  if (b_5[1]._4_4_ != 0) {
    *local_4a0 = value2 / *(double *)*local_490;
  }
  for (local_35f0 = 0; local_35f0 < length; local_35f0 = local_35f0 + 1) {
    bVar25 = anon_unknown.dwarf_1996d::equal<double>(peVar27[local_35f0],value2 / value1);
    if (!bVar25) {
      puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar28 + 1) = 0x6b;
      *(uint *)((long)puVar28 + 0xc) = length;
      __cxa_throw(puVar28,&Exception::typeinfo,0);
    }
  }
  if ((!allowTrash) && ((peVar27[length] != 127.0 || (NAN(peVar27[length]))))) {
    puVar28 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar28 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
    *(undefined4 *)(puVar28 + 1) = 0x70;
    *(uint *)((long)puVar28 + 0xc) = length;
    __cxa_throw(puVar28,&Exception::typeinfo,0);
  }
  std::shared_ptr<double>::~shared_ptr((shared_ptr<double> *)&v1);
  std::shared_ptr<double>::~shared_ptr((shared_ptr<double> *)local_3580);
  std::shared_ptr<double>::~shared_ptr
            ((shared_ptr<double> *)
             &pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}